

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

Matrix<float,_3,_3> *
deqp::gles3::Functional::MatrixCaseUtils::inverse<3>
          (Matrix<float,_3,_3> *__return_storage_ptr__,Matrix<float,_3,_3> *mat)

{
  undefined1 *puVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  bool bVar8;
  undefined8 in_RAX;
  Matrix<float,_3,_3> *pMVar9;
  float *pfVar10;
  int row;
  bool bVar11;
  Vector<float,_3> *pVVar12;
  int col;
  float *pfVar13;
  undefined1 *puVar14;
  bool bVar15;
  bool bVar16;
  long lVar17;
  long lVar18;
  float v;
  float fVar19;
  float fVar20;
  float v_3;
  float fVar21;
  float fVar22;
  undefined1 auVar23 [16];
  float fVar24;
  float local_ac;
  undefined1 local_a8 [16];
  float local_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float afStack_78 [2];
  Matrix<float,_2,_2> retVal;
  float local_58 [5];
  float local_44;
  Matrix<float,_2,_2> res;
  Matrix<float,_2,_2> res_1;
  
  pMVar9 = __return_storage_ptr__;
  fVar21 = (mat->m_data).m_data[0].m_data[0];
  fVar19 = (mat->m_data).m_data[1].m_data[0];
  fVar20 = (mat->m_data).m_data[1].m_data[1];
  fVar2 = (mat->m_data).m_data[2].m_data[0];
  fVar3 = (mat->m_data).m_data[2].m_data[1];
  fVar4 = (mat->m_data).m_data[0].m_data[2];
  fVar5 = (mat->m_data).m_data[1].m_data[2];
  fVar6 = (mat->m_data).m_data[2].m_data[2];
  puVar1 = local_a8 + 8;
  fVar24 = -(mat->m_data).m_data[0].m_data[1];
  fVar22 = fVar21 * fVar20 + fVar19 * fVar24;
  auVar23._4_4_ = fVar24;
  auVar23._0_4_ = fVar20;
  auVar23._8_4_ = -fVar19;
  auVar23._12_4_ = fVar21;
  auVar7._4_4_ = fVar22;
  auVar7._0_4_ = fVar22;
  auVar7._8_4_ = fVar22;
  auVar7._12_4_ = fVar22;
  local_a8 = divps(auVar23,auVar7);
  local_58[0] = 1.0;
  local_88 = 0.0;
  pfVar10 = local_58;
  puVar14 = local_a8;
  bVar8 = true;
  do {
    bVar15 = bVar8;
    fVar19 = 0.0;
    lVar18 = 0;
    fVar21 = fVar4;
    bVar8 = true;
    do {
      bVar11 = bVar8;
      fVar19 = fVar19 + fVar21 * *(float *)(puVar14 + lVar18 * 4);
      lVar18 = 1;
      fVar21 = fVar5;
      bVar8 = false;
    } while (bVar11);
    *pfVar10 = fVar19;
    pfVar10 = &local_88;
    puVar14 = puVar1;
    bVar8 = false;
  } while (bVar15);
  fVar19 = 0.0;
  pfVar10 = local_58;
  fVar21 = fVar2;
  bVar8 = true;
  do {
    bVar15 = bVar8;
    fVar19 = fVar19 + fVar21 * *pfVar10;
    pfVar10 = &local_88;
    fVar21 = fVar3;
    bVar8 = false;
  } while (bVar15);
  retVal.m_data.m_data[1].m_data[0] = 0.0;
  retVal.m_data.m_data[1].m_data[1] = 0.0;
  local_ac = 1.0;
  local_8c = 0.0;
  pfVar10 = &local_ac;
  puVar14 = local_a8;
  bVar8 = true;
  do {
    bVar15 = bVar8;
    fVar20 = 0.0;
    lVar18 = 0;
    fVar21 = fVar2;
    bVar8 = true;
    do {
      bVar11 = bVar8;
      fVar20 = fVar20 + fVar21 * *(float *)(puVar14 + lVar18 * 8);
      lVar18 = 1;
      fVar21 = fVar3;
      bVar8 = false;
    } while (bVar11);
    *pfVar10 = fVar20;
    pfVar10 = &local_8c;
    puVar14 = local_a8 + 4;
    bVar8 = false;
  } while (bVar15);
  res.m_data.m_data[1].m_data[0] = 1.0 / (fVar6 - fVar19);
  afStack_78[0] = fVar4 * local_ac * res.m_data.m_data[1].m_data[0] + 0.0;
  afStack_78[1] = fVar4 * local_8c * res.m_data.m_data[1].m_data[0] + 0.0;
  retVal.m_data.m_data[0].m_data[0] = fVar5 * local_ac * res.m_data.m_data[1].m_data[0] + 0.0;
  retVal.m_data.m_data[0].m_data[1] = fVar5 * local_8c * res.m_data.m_data[1].m_data[0] + 0.0;
  local_58[0] = 1.0;
  local_58[1] = 0.0;
  local_58[2] = 0.0;
  local_58[3] = 1.0;
  pfVar10 = local_58;
  pfVar13 = afStack_78;
  bVar8 = true;
  do {
    bVar15 = bVar8;
    lVar18 = 0;
    puVar14 = local_a8;
    bVar8 = true;
    do {
      bVar11 = bVar8;
      fVar21 = 0.0;
      lVar17 = 0;
      bVar8 = true;
      do {
        bVar16 = bVar8;
        fVar21 = fVar21 + pfVar13[lVar17 * 2] * *(float *)(puVar14 + lVar17 * 4);
        lVar17 = 1;
        bVar8 = false;
      } while (bVar16);
      pfVar10[lVar18 * 2] = fVar21;
      lVar18 = 1;
      puVar14 = puVar1;
      bVar8 = false;
    } while (bVar11);
    pfVar10 = local_58 + 1;
    pfVar13 = afStack_78 + 1;
    bVar8 = false;
  } while (bVar15);
  local_88 = (float)local_58._0_8_ + local_a8._0_4_;
  fStack_84 = SUB84(local_58._0_8_,4) + local_a8._4_4_;
  fStack_80 = (float)local_58._8_8_ + local_a8._8_4_;
  fStack_7c = SUB84(local_58._8_8_,4) + local_a8._12_4_;
  local_58[1] = 0.0 - local_a8._4_4_;
  local_58[0] = 0.0 - local_a8._0_4_;
  local_58[3] = 0.0 - local_a8._12_4_;
  local_58[2] = 0.0 - local_a8._8_4_;
  afStack_78[0] = 1.0;
  local_ac = 0.0;
  pfVar10 = local_58;
  pfVar13 = afStack_78;
  bVar8 = true;
  do {
    bVar15 = bVar8;
    fVar19 = 0.0;
    lVar18 = 0;
    fVar21 = fVar2;
    bVar8 = true;
    do {
      bVar11 = bVar8;
      fVar19 = fVar19 + fVar21 * pfVar10[lVar18 * 2];
      lVar18 = 1;
      fVar21 = fVar3;
      bVar8 = false;
    } while (bVar11);
    *pfVar13 = fVar19;
    pfVar10 = local_58 + 1;
    pfVar13 = &local_ac;
    bVar8 = false;
  } while (bVar15);
  fVar21 = afStack_78[0] * res.m_data.m_data[1].m_data[0];
  local_58[0] = 1.0;
  afStack_78[0] = 0.0;
  pfVar10 = local_58;
  puVar14 = local_a8;
  bVar8 = true;
  do {
    bVar15 = bVar8;
    fVar20 = 0.0;
    lVar18 = 0;
    fVar19 = fVar4;
    bVar8 = true;
    do {
      bVar11 = bVar8;
      fVar20 = fVar20 + fVar19 * *(float *)(puVar14 + lVar18 * 4);
      lVar18 = 1;
      fVar19 = fVar5;
      bVar8 = false;
    } while (bVar11);
    *pfVar10 = fVar20;
    pfVar10 = afStack_78;
    puVar14 = puVar1;
    bVar8 = false;
  } while (bVar15);
  pfVar10 = local_58;
  fVar19 = local_58[0];
  local_58[1] = fStack_80;
  local_58[0] = local_88;
  local_58[3] = fStack_84;
  local_58[2] = fVar21;
  local_58[4] = fStack_7c;
  local_44 = local_ac * res.m_data.m_data[1].m_data[0];
  res.m_data.m_data[0].m_data[0] = -res.m_data.m_data[1].m_data[0] * fVar19;
  res.m_data.m_data[0].m_data[1] = -res.m_data.m_data[1].m_data[0] * afStack_78[0];
  res.m_data.m_data[1].m_data[1] = (float)((ulong)in_RAX >> 0x20);
  pVVar12 = (__return_storage_ptr__->m_data).m_data;
  pVVar12[1].m_data[1] = 0.0;
  pVVar12[1].m_data[2] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[1] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[1] = 0.0;
  *(undefined8 *)((__return_storage_ptr__->m_data).m_data[0].m_data + 2) = 0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[2] = 0.0;
  lVar18 = 0;
  do {
    lVar17 = 0;
    pVVar12 = (Vector<float,_3> *)__return_storage_ptr__;
    do {
      ((Vector<tcu::Vector<float,_3>,_3> *)pVVar12->m_data)->m_data[0].m_data[0] = pfVar10[lVar17];
      lVar17 = lVar17 + 1;
      pVVar12 = pVVar12 + 1;
    } while (lVar17 != 3);
    lVar18 = lVar18 + 1;
    __return_storage_ptr__ =
         (Matrix<float,_3,_3> *)(((Vector<float,_3> *)__return_storage_ptr__)->m_data + 1);
    pfVar10 = pfVar10 + 3;
  } while (lVar18 != 3);
  return pMVar9;
}

Assistant:

tcu::Matrix<float, 3, 3> inverse<3> (const tcu::Matrix<float, 3, 3>& mat)
{
	// Blockwise inversion

	DE_ASSERT(determinant(mat) != 0.0f);

	const float areaA[2*2] =
	{
		mat(0,0),	mat(0,1),
		mat(1,0),	mat(1,1)
	};
	const float areaB[2] =
	{
		mat(0,2),
		mat(1,2),
	};
	const float areaC[2] =
	{
		mat(2,0),	mat(2,1),
	};
	const float areaD[1] =
	{
		mat(2,2)
	};
	const float nullField[4] = { 0.0f };

	const tcu::Matrix<float, 2, 2>	invA = inverse(tcu::Matrix<float, 2, 2>(areaA));
	const tcu::Matrix<float, 2, 1>	matB =         tcu::Matrix<float, 2, 1>(areaB);
	const tcu::Matrix<float, 1, 2>	matC =         tcu::Matrix<float, 1, 2>(areaC);
	const tcu::Matrix<float, 1, 1>	matD =         tcu::Matrix<float, 1, 1>(areaD);

	const float						schurComplement = 1.0f / (matD - matC*invA*matB)(0,0);
	const tcu::Matrix<float, 2, 2>	zeroMat         = Mat2(nullField);

	const tcu::Matrix<float, 2, 2>	blockA = invA + invA*matB*schurComplement*matC*invA;
	const tcu::Matrix<float, 2, 1>	blockB = (zeroMat-invA)*matB*schurComplement;
	const tcu::Matrix<float, 1, 2>	blockC = matC*invA*(-schurComplement);
	const float						blockD = schurComplement;

	const float result[3*3] =
	{
		blockA(0,0),	blockA(0,1),	blockB(0,0),
		blockA(1,0),	blockA(1,1),	blockB(1,0),
		blockC(0,0),	blockC(0,1),	blockD,
	};

	return Mat3(result);
}